

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

size_t PHF::uniq<std::__cxx11::string>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,size_t n)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  qsort(k,n,0x20,Uniq::cmp<std::__cxx11::string>);
  __lhs = k + 1;
  lVar3 = 0;
  for (uVar2 = 1; uVar2 < n; uVar2 = uVar2 + 1) {
    bVar1 = std::operator!=(__lhs,k + lVar3);
    if (bVar1) {
      lVar3 = lVar3 + 1;
      std::__cxx11::string::_M_assign((string *)(k + lVar3));
    }
    __lhs = __lhs + 1;
  }
  sVar4 = lVar3 + 1;
  if (n == 0) {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}